

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O3

void __thiscall
RandomWordTestData<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::RandomWordTestData
          (RandomWordTestData<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,char in_delim,size_t in_fixed_word_count,size_t in_fixed_word_length)

{
  (this->m_delim)._M_dataplus._M_p = (pointer)&(this->m_delim).field_2;
  (this->m_delim)._M_string_length = 0;
  (this->m_delim).field_2._M_local_buf[0] = '\0';
  this->m_fixed_word_count = in_fixed_word_count;
  this->m_fixed_word_length = in_fixed_word_length;
  (this->m_str)._M_dataplus._M_p = (pointer)&(this->m_str).field_2;
  (this->m_str)._M_string_length = 0;
  (this->m_str).field_2._M_local_buf[0] = '\0';
  (this->m_tokens).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tokens).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tokens).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_token_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_token_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_token_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
            (&this->m_delim,0,0,1,in_delim);
  populate(this);
  return;
}

Assistant:

RandomWordTestData(T in_delim = default_delim<T>, size_t in_fixed_word_count = 0, size_t in_fixed_word_length = 0)
		: m_fixed_word_count{ in_fixed_word_count },
		m_fixed_word_length{ in_fixed_word_length } {
		m_delim.insert(m_delim.end(), in_delim);
		populate();
	}